

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_enum_all_next(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint8_t *arr_00;
  long lVar5;
  ulong uVar6;
  MTBDD local_50;
  
  arr_00 = arr + 1;
  while( true ) {
    if (dd == 0) {
      return 0;
    }
    if (variables == 0x8000000000000000) break;
    puVar1 = nodes->data;
    lVar4 = (variables & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar4);
    uVar6 = dd;
    if (((dd & 0x7fffffffffffffff) == 0) ||
       (lVar5 = (dd & 0xffffffffff) * 0x10, (puVar1[lVar5 + 7] & 0x40) != 0)) {
      if ((filter_cb != (mtbdd_enum_filter_cb)0x0) && (iVar3 = (*filter_cb)(dd), iVar3 == 0)) {
        return 0;
      }
    }
    else if ((*(ulong *)(puVar1 + lVar4 + 8) ^ *(ulong *)(puVar1 + lVar5 + 8)) < 0x10000000000) {
      uVar6 = dd & 0x8000000000000000;
      dd = *(ulong *)(puVar1 + lVar5) & 0x800000ffffffffff ^ uVar6;
      uVar6 = *(ulong *)(puVar1 + lVar5 + 8) & 0xffffffffff | uVar6;
    }
    variables = variables & 0x8000000000000000 ^ uVar2 & 0x800000ffffffffff;
    if (arr_00[-1] != '\x01') {
      if (arr_00[-1] == '\0') {
        local_50 = mtbdd_enum_all_next(uVar6,variables,arr_00,filter_cb);
        if (local_50 == 0) {
          local_50 = mtbdd_enum_all_first(dd,variables,arr_00,filter_cb);
          if (local_50 == 0) {
            local_50 = 0;
          }
          else {
            arr_00[-1] = '\x01';
          }
        }
        return local_50;
      }
      __assert_fail("*arr == 0 || *arr == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                    ,0xaa1,
                    "MTBDD mtbdd_enum_all_next(MTBDD, MTBDD, uint8_t *, mtbdd_enum_filter_cb)");
    }
    arr_00 = arr_00 + 1;
  }
  return 0;
}

Assistant:

MTBDD
mtbdd_enum_all_next(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf False is skipped
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // if this assertion fails, then <variables> is not the support of <dd>.
        // actually, remove this check to allow for "partial" enumeration
        // assert(mtbdd_isleaf(dd));
        // no next if there are no variables
        return mtbdd_false;
    } else {
        // get next variable from <variables>
        mtbddnode_t nv = MTBDD_GETNODE(variables);
        variables = node_gethigh(variables, nv);

        // filter leaf (if leaf) or get cofactors (if not leaf)
        mtbddnode_t ndd = MTBDD_GETNODE(dd);
        MTBDD low, high;
        if (mtbdd_isleaf(dd)) {
            // a leaf for which the filter returns 0 is skipped
            if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
            low = high = dd;
        } else {
            // get cofactors
            if (mtbddnode_getvariable(ndd) == mtbddnode_getvariable(nv)) {
                low = node_getlow(dd, ndd);
                high = node_gethigh(dd, ndd);
            } else {
                low = high = dd;
            }
        }

        // try recursive next first
        if (*arr == 0) {
            MTBDD res = mtbdd_enum_all_next(low, variables, arr+1, filter_cb);
            if (res != mtbdd_false) return res;
        } else if (*arr == 1) {
            return mtbdd_enum_all_next(high, variables, arr+1, filter_cb);
            // if *arr was 1 and _next returns False, return False
        } else {
            // the array is invalid...
            assert(*arr == 0 || *arr == 1);
            return mtbdd_invalid;  // in Release mode, the assertion is empty code
        }

        // previous was low, try following high
        MTBDD res = mtbdd_enum_all_first(high, variables, arr+1, filter_cb);
        if (res == mtbdd_false) return mtbdd_false;

        // succesful, set arr
        *arr = 1;
        return res;
    }
}